

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

Symbol * slang::ast::Lookup::unqualifiedAt
                   (Scope *scope,string_view name,LookupLocation location,SourceRange sourceRange,
                   bitmask<slang::ast::LookupFlags> flags)

{
  bool bVar1;
  Scope *in_RDI;
  LookupResult result;
  _Optional_payload_base<slang::SourceRange> in_stack_00000810;
  SymbolIndex in_stack_00000828;
  LookupResult *in_stack_00000830;
  Scope *in_stack_00000838;
  SyntaxNode *in_stack_00000840;
  SourceRange *in_stack_fffffffffffffc68;
  LookupResult *in_stack_fffffffffffffc70;
  LookupResult *in_stack_fffffffffffffca8;
  LookupResult *in_stack_fffffffffffffd18;
  LookupResult *diagnostics;
  Compilation *in_stack_fffffffffffffd20;
  SourceRange *local_2c0;
  optional<slang::SourceRange> *poStack_2b8;
  Symbol *local_280;
  char in_stack_fffffffffffffe37;
  LookupResult *in_stack_fffffffffffffe38;
  Scope *in_stack_fffffffffffffe40;
  _Optional_payload_base<slang::SourceRange> in_stack_fffffffffffffe50;
  char in_stack_fffffffffffffee7;
  Scope *in_stack_fffffffffffffee8;
  bitmask<slang::ast::LookupFlags> in_stack_fffffffffffffef4;
  SourceRange in_stack_fffffffffffffef8;
  string_view in_stack_ffffffffffffff08;
  LookupResult *in_stack_ffffffffffffff28;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  Symbol *local_10;
  
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_20);
  if (bVar1) {
    local_10 = (Symbol *)0x0;
  }
  else {
    LookupResult::LookupResult(in_stack_fffffffffffffc70);
    std::optional<slang::SourceRange>::optional<slang::SourceRange_&,_true>
              ((optional<slang::SourceRange> *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    unqualifiedImpl(scope,name,location,(optional<slang::SourceRange>)in_stack_00000810,flags,
                    in_stack_00000828,in_stack_00000830,in_stack_00000838,in_stack_00000840);
    std::optional<slang::SourceRange>::optional<slang::SourceRange_&,_true>(poStack_2b8,local_2c0);
    diagnostics = in_stack_fffffffffffffd18;
    anon_unknown_39::unwrapResult
              (in_stack_fffffffffffffe40,(optional<slang::SourceRange>)in_stack_fffffffffffffe50,
               in_stack_fffffffffffffe38,(bool)in_stack_fffffffffffffe37);
    if ((local_280 == (Symbol *)0x0) &&
       (bVar1 = LookupResult::hasError(in_stack_fffffffffffffca8), !bVar1)) {
      in_stack_fffffffffffffd18 = (LookupResult *)&local_280;
      reportUndeclared(in_stack_fffffffffffffee8,in_stack_ffffffffffffff08,in_stack_fffffffffffffef8
                       ,in_stack_fffffffffffffef4,(bool)in_stack_fffffffffffffee7,
                       in_stack_ffffffffffffff28);
    }
    bVar1 = LookupResult::hasError(in_stack_fffffffffffffca8);
    if (bVar1) {
      Scope::getCompilation(in_RDI);
      LookupResult::getDiagnostics((LookupResult *)&local_280);
      Compilation::addDiagnostics(in_stack_fffffffffffffd20,(Diagnostics *)diagnostics);
    }
    local_10 = local_280;
    LookupResult::~LookupResult(in_stack_fffffffffffffd18);
  }
  return local_10;
}

Assistant:

const Symbol* Lookup::unqualifiedAt(const Scope& scope, std::string_view name,
                                    LookupLocation location, SourceRange sourceRange,
                                    bitmask<LookupFlags> flags) {
    if (name.empty())
        return nullptr;

    LookupResult result;
    unqualifiedImpl(scope, name, location, sourceRange, flags, {}, result, scope, nullptr);

    SLANG_ASSERT(result.selectors.empty());
    unwrapResult(scope, sourceRange, result, /* unwrapGenericClasses */ false);

    if (!result.found && !result.hasError())
        reportUndeclared(scope, name, sourceRange, flags, false, result);

    if (result.hasError())
        scope.getCompilation().addDiagnostics(result.getDiagnostics());

    return result.found;
}